

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O1

int bench_ecmult_multi_callback(secp256k1_scalar *sc,secp256k1_ge *ge,size_t idx,void *arg)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bench_data *data;
  long lVar5;
  int iVar6;
  long lVar7;
  secp256k1_ge *psVar8;
  ulong uVar9;
  
  lVar5 = *(long *)((long)arg + 0x10);
  lVar7 = (*(int *)((long)arg + 0x48) != 0) + idx;
  if (lVar7 == 0) {
    lVar7 = *(long *)((long)arg + 0x50) * 0x20;
    puVar1 = (uint64_t *)(lVar5 + lVar7);
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    puVar1 = (uint64_t *)(lVar5 + 0x10 + lVar7);
    uVar4 = puVar1[1];
    sc->d[2] = *puVar1;
    sc->d[3] = uVar4;
    sc->d[0] = uVar2;
    sc->d[1] = uVar3;
    psVar8 = &secp256k1_ge_const_g;
  }
  else {
    iVar6 = (int)lVar7;
    uVar9 = (ulong)(((int)*(long *)((long)arg + 0x50) + iVar6 & 0x7fffU) << 5);
    puVar1 = (uint64_t *)(lVar5 + uVar9);
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    puVar1 = (uint64_t *)(lVar5 + 0x10 + uVar9);
    uVar4 = puVar1[1];
    sc->d[2] = *puVar1;
    sc->d[3] = uVar4;
    sc->d[0] = uVar2;
    sc->d[1] = uVar3;
    psVar8 = (secp256k1_ge *)
             ((ulong)((iVar6 + *(int *)((long)arg + 0x58)) - 1U & 0x7fff) * 0x58 +
             *(long *)((long)arg + 0x18));
  }
  for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
    (ge->x).n[0] = (psVar8->x).n[0];
    psVar8 = (secp256k1_ge *)((psVar8->x).n + 1);
    ge = (secp256k1_ge *)((ge->x).n + 1);
  }
  return 1;
}

Assistant:

static int bench_ecmult_multi_callback(secp256k1_scalar* sc, secp256k1_ge* ge, size_t idx, void* arg) {
    bench_data* data = (bench_data*)arg;
    if (data->includes_g) ++idx;
    if (idx == 0) {
        *sc = data->scalars[data->offset1];
        *ge = secp256k1_ge_const_g;
    } else {
        *sc = data->scalars[(data->offset1 + idx) % POINTS];
        *ge = data->pubkeys[(data->offset2 + idx - 1) % POINTS];
    }
    return 1;
}